

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl.h
# Opt level: O3

void a__GLTargetBind(AGLDrawTarget *target)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  AGLFramebuffer *pAVar4;
  GLuint GVar5;
  undefined1 auVar6 [16];
  
  pAVar4 = target->framebuffer;
  if (pAVar4 == (AGLFramebuffer *)0x0) {
    GVar5 = 0;
  }
  else {
    GVar5 = pAVar4->name;
  }
  if (a__gl_state.framebuffer.binding != GVar5) {
    a__gl_state.framebuffer.binding = GVar5;
    pAVar4 = (AGLFramebuffer *)glBindFramebuffer(0x8d40);
  }
  uVar1._0_4_ = (target->viewport).x;
  uVar1._4_4_ = (target->viewport).y;
  auVar6._0_4_ = -(uint)(a__gl_state.viewport.x == (undefined4)uVar1);
  auVar6._4_4_ = auVar6._0_4_;
  auVar6._8_4_ = -(uint)(a__gl_state.viewport.y == uVar1._4_4_);
  auVar6._12_4_ = -(uint)(a__gl_state.viewport.y == uVar1._4_4_);
  iVar3 = movmskpd((int)pAVar4,auVar6);
  if (((iVar3 == 3) && ((target->viewport).w == a__gl_state.viewport.w)) &&
     ((target->viewport).h == a__gl_state.viewport.h)) {
    return;
  }
  uVar2._0_4_ = (target->viewport).w;
  uVar2._4_4_ = (target->viewport).h;
  a__gl_state.viewport.w = (undefined4)uVar2;
  a__gl_state.viewport.h = uVar2._4_4_;
  a__gl_state.viewport.x = (undefined4)uVar1;
  a__gl_state.viewport.y = uVar1._4_4_;
  glViewport(uVar1 & 0xffffffff,uVar1._4_4_,uVar2,uVar2 >> 0x20);
  return;
}

Assistant:

static void a__GLTargetBind(const AGLDrawTarget *target) {
	ATTO_GL_PROFILE_PREAMBLE
	a__GLFramebufferBind(target->framebuffer);

	if (target->viewport.x != a__gl_state.viewport.x || target->viewport.y != a__gl_state.viewport.y ||
		target->viewport.w != a__gl_state.viewport.w || target->viewport.h != a__gl_state.viewport.h) {
		a__gl_state.viewport.x = target->viewport.x;
		a__gl_state.viewport.y = target->viewport.y;
		a__gl_state.viewport.w = target->viewport.w;
		a__gl_state.viewport.h = target->viewport.h;

		AGL__CALL(glViewport(target->viewport.x, target->viewport.y, target->viewport.w, target->viewport.h));
	}
	ATTO_GL_PROFILE_FUNC(__FUNCTION__, aAppTime() - start);
}